

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandWeaponAmmo::Tick
          (CommandWeaponAmmo *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  SBarInfoCommand **ppSVar1;
  long *plVar2;
  AWeapon *pAVar3;
  PClassAmmo *pPVar4;
  PClassAmmo *pPVar5;
  PClassAmmo *pPVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  
  bVar7 = (this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.truth;
  uVar9 = (ulong)(this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.
                 commands[bVar7].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  if (uVar9 != 0) {
    ppSVar1 = (this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.commands
              [bVar7].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar10 = 0;
    do {
      plVar2 = *(long **)((long)ppSVar1 + lVar10);
      (**(code **)(*plVar2 + 0x28))(plVar2,block,statusBar,hudChanged);
      lVar10 = lVar10 + 8;
    } while (uVar9 << 3 != lVar10);
  }
  pAVar3 = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon;
  if (pAVar3 == (AWeapon *)0x0) goto LAB_004cbc1a;
  pPVar4 = pAVar3->AmmoType1;
  pPVar5 = pAVar3->AmmoType2;
  pPVar6 = (PClassAmmo *)this->ammo[1];
  if (pPVar6 == (PClassAmmo *)0x0) {
    if ((pPVar4 == (PClassAmmo *)this->ammo[0] && pPVar4 != (PClassAmmo *)0x0) ||
       (pPVar5 != (PClassAmmo *)0x0 && pPVar5 == (PClassAmmo *)this->ammo[0])) goto LAB_004cbbed;
LAB_004cbbe9:
    bVar7 = false;
  }
  else {
    if ((pPVar4 == (PClassAmmo *)0x0) ||
       ((bVar7 = true, pPVar4 != pPVar6 && (pPVar4 != (PClassAmmo *)this->ammo[0])))) {
      bVar7 = pPVar4 == (PClassAmmo *)0x0;
    }
    if ((pPVar5 == (PClassAmmo *)0x0) ||
       ((bVar8 = true, pPVar5 != pPVar6 && (pPVar5 != (PClassAmmo *)this->ammo[0])))) {
      bVar8 = pPVar5 == (PClassAmmo *)0x0;
    }
    if (((byte)((this->conditionAnd ^ 1U) & (bVar7 | bVar8)) == 0) &&
       ((this->conditionAnd & bVar7 & bVar8) == 0)) goto LAB_004cbbe9;
LAB_004cbbed:
    bVar7 = true;
    if (((this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.truth == false)
       && ((this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.truth = true,
          block != (SBarInfoMainBlock *)0x0)) {
      (*(this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.
        super_SBarInfoCommand._vptr_SBarInfoCommand[5])(this,block,statusBar,1);
      bVar7 = true;
    }
  }
  if (bVar7) {
    return;
  }
LAB_004cbc1a:
  if (((this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.truth != false)
     && ((this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.truth = false,
        block != (SBarInfoMainBlock *)0x0)) {
    (*(this->super_SBarInfoNegatableFlowControl).super_SBarInfoCommandFlowControl.
      super_SBarInfoCommand._vptr_SBarInfoCommand[5])(this,block,statusBar,1);
    return;
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoNegatableFlowControl::Tick(block, statusBar, hudChanged);

			if(statusBar->CPlayer->ReadyWeapon != NULL)
			{
				const PClass *AmmoType1 = statusBar->CPlayer->ReadyWeapon->AmmoType1;
				const PClass *AmmoType2 = statusBar->CPlayer->ReadyWeapon->AmmoType2;
				bool usesammo1 = (AmmoType1 != NULL);
				bool usesammo2 = (AmmoType2 != NULL);
				//if(!usesammo1 && !usesammo2) //if the weapon doesn't use ammo don't go though the trouble.
				//{
				//	SetTruth(false, block, statusBar);
				//	return;
				//}
				//Or means only 1 ammo type needs to match and means both need to match.
				if(ammo[1] != NULL)
				{
					bool match1 = ((usesammo1 && (AmmoType1 == ammo[0] || AmmoType1 == ammo[1])) || !usesammo1);
					bool match2 = ((usesammo2 && (AmmoType2 == ammo[0] || AmmoType2 == ammo[1])) || !usesammo2);
					if((!conditionAnd && (match1 || match2)) || (conditionAnd && (match1 && match2)))
					{
						SetTruth(true, block, statusBar);
						return;
					}
				}
				else
				{
					if((usesammo1 && (AmmoType1 == ammo[0])) || (usesammo2 && (AmmoType2 == ammo[0])))
					{
						SetTruth(true, block, statusBar);
						return;
					}
				}
			}
			SetTruth(false, block, statusBar);
		}